

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlTextureParameters(uint id,int param,int value)

{
  int value_local;
  int param_local;
  uint id_local;
  
  (*glad_glBindTexture)(0xde1,id);
  if (param - 0x2800U < 2) {
    (*glad_glTexParameteri)(0xde1,param,value);
  }
  else if (param - 0x2802U < 2) {
    if (value == 0x8742) {
      if ((RLGL.ExtSupported.texMirrorClamp & 1U) == 0) {
        TraceLog(4,"GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)");
      }
      else {
        (*glad_glTexParameteri)(0xde1,param,0x8742);
      }
    }
    else {
      (*glad_glTexParameteri)(0xde1,param,value);
    }
  }
  else if (param == 0x3000) {
    if (RLGL.ExtSupported.maxAnisotropyLevel < (float)value) {
      if (RLGL.ExtSupported.maxAnisotropyLevel <= 0.0) {
        TraceLog(4,"GL: Anisotropic filtering not supported");
      }
      else {
        TraceLog(4,"GL: Maximum anisotropic filter level supported is %iX",
                 (double)RLGL.ExtSupported.maxAnisotropyLevel,(ulong)id);
        (*glad_glTexParameterf)(0xde1,0x84fe,(float)value);
      }
    }
    else {
      (*glad_glTexParameterf)(0xde1,0x84fe,(float)value);
    }
  }
  (*glad_glBindTexture)(0xde1,0);
  return;
}

Assistant:

void rlTextureParameters(unsigned int id, int param, int value)
{
    glBindTexture(GL_TEXTURE_2D, id);

    switch (param)
    {
        case RL_TEXTURE_WRAP_S:
        case RL_TEXTURE_WRAP_T:
        {
            if (value == RL_TEXTURE_WRAP_MIRROR_CLAMP)
            {
#if !defined(GRAPHICS_API_OPENGL_11)
                if (RLGL.ExtSupported.texMirrorClamp) glTexParameteri(GL_TEXTURE_2D, param, value);
                else TRACELOG(LOG_WARNING, "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)");
#endif
            }
            else glTexParameteri(GL_TEXTURE_2D, param, value);

        } break;
        case RL_TEXTURE_MAG_FILTER:
        case RL_TEXTURE_MIN_FILTER: glTexParameteri(GL_TEXTURE_2D, param, value); break;
        case RL_TEXTURE_FILTER_ANISOTROPIC:
        {
#if !defined(GRAPHICS_API_OPENGL_11)
            if (value <= RLGL.ExtSupported.maxAnisotropyLevel) glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            else if (RLGL.ExtSupported.maxAnisotropyLevel > 0.0f)
            {
                TRACELOG(LOG_WARNING, "GL: Maximum anisotropic filter level supported is %iX", id, RLGL.ExtSupported.maxAnisotropyLevel);
                glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            }
            else TRACELOG(LOG_WARNING, "GL: Anisotropic filtering not supported");
#endif
        } break;
        default: break;
    }

    glBindTexture(GL_TEXTURE_2D, 0);
}